

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_model.c
# Opt level: O0

int32 nextline_str2words(FILE *fp,int32 *lineno,char **lineptr,char ***wordptr)

{
  int32 iVar1;
  char **ppcVar2;
  void *pvVar3;
  int32 n;
  size_t len;
  char ***wordptr_local;
  char **lineptr_local;
  int32 *lineno_local;
  FILE *fp_local;
  
  len = (size_t)wordptr;
  wordptr_local = (char ***)lineptr;
  lineptr_local = (char **)lineno;
  lineno_local = &fp->_flags;
  do {
    ckd_free(*wordptr_local);
    ppcVar2 = (char **)fread_line((FILE *)lineno_local,(size_t *)&stack0xffffffffffffffc8);
    *wordptr_local = ppcVar2;
    if (ppcVar2 == (char **)0x0) {
      return -1;
    }
    *(int *)lineptr_local = *(int *)lineptr_local + 1;
  } while ((*(char *)*wordptr_local == '#') ||
          (iVar1 = str2words((char *)*wordptr_local,(char **)0x0,0), iVar1 == 0));
  if (*(long *)len == 0) {
    pvVar3 = __ckd_calloc__((long)iVar1,8,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                            ,0x55);
    *(void **)len = pvVar3;
  }
  else {
    pvVar3 = __ckd_realloc__(*(void **)len,(long)iVar1 << 3,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                             ,0x57);
    *(void **)len = pvVar3;
  }
  iVar1 = str2words((char *)*wordptr_local,*(char ***)len,iVar1);
  return iVar1;
}

Assistant:

static int32
nextline_str2words(FILE * fp, int32 * lineno,
                   char **lineptr, char ***wordptr)
{
    for (;;) {
        size_t len;
        int32 n;

        ckd_free(*lineptr);
        if ((*lineptr = fread_line(fp, &len)) == NULL)
            return -1;

        (*lineno)++;

        if ((*lineptr)[0] == FSG_MODEL_COMMENT_CHAR)
            continue;           /* Skip comment lines */

        n = str2words(*lineptr, NULL, 0);
        if (n == 0)
            continue;           /* Skip blank lines */

        /* Abuse of realloc(), but this doesn't have to be fast. */
        if (*wordptr == NULL)
            *wordptr = ckd_calloc(n, sizeof(**wordptr));
        else
            *wordptr = ckd_realloc(*wordptr, n * sizeof(**wordptr));
        return str2words(*lineptr, *wordptr, n);
    }
}